

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferOperations.cpp
# Opt level: O3

void __thiscall
glcts::TextureBufferOperationsViaBufferObjectLoad::initializeBufferObjectData
          (TextureBufferOperationsViaBufferObjectLoad *this)

{
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  vector<int,_std::allocator<int>_> data;
  allocator_type local_31;
  vector<int,_std::allocator<int>_> local_30;
  
  iVar1 = (*((this->super_TextureBufferOperations).super_TestCaseBase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  std::vector<int,_std::allocator<int>_>::vector
            (&local_30,
             (ulong)(uint)((this->super_TextureBufferOperations).m_n_vectors_in_buffer_texture << 2)
             ,&local_31);
  (*(this->super_TextureBufferOperations).super_TestCaseBase.super_TestCase.super_TestNode.
    _vptr_TestNode[7])
            (this,local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start,
             (ulong)(uint)((this->super_TextureBufferOperations).m_n_vectors_in_buffer_texture << 2)
            );
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x168))
            ((this->super_TextureBufferOperations).super_TestCaseBase.m_glExtTokens.TEXTURE_BUFFER,0
             ,(ulong)(uint)((this->super_TextureBufferOperations).m_n_vectors_in_buffer_texture << 2
                           ) << 2,
             local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start);
  err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  glu::checkError(err,"Error setting buffer object data!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                  ,0x312);
  if (local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void TextureBufferOperationsViaBufferObjectLoad::initializeBufferObjectData(void)
{
	/* Get GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	std::vector<glw::GLint> data(m_n_vectors_in_buffer_texture * m_n_vector_components);
	fillBufferWithData(&data[0], m_n_vectors_in_buffer_texture * m_n_vector_components);

	gl.bufferSubData(m_glExtTokens.TEXTURE_BUFFER, 0,
					 m_n_vectors_in_buffer_texture * m_n_vector_components * sizeof(glw::GLint), &data[0]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting buffer object data!");
}